

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::StoreVariableOperator> *op)

{
  element_type *peVar1;
  char *pcVar2;
  size_type sVar3;
  int iVar4;
  ostream *poVar5;
  char local_2d;
  int local_2c;
  
  iVar4 = ProcessOperator(this,(shared_ptr<const_calc4::Operator> *)
                               (((op->
                                 super___shared_ptr<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->operand).
                               super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
  poVar5 = Append(this);
  peVar1 = (op->super___shared_ptr<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pcVar2 = (peVar1->variableName)._M_dataplus._M_p;
  sVar3 = (peVar1->variableName)._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"user_defined_var_",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"var_",4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  local_2d = ';';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2d,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_2c = iVar4;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&(this->stack).c,&local_2c);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const StoreVariableOperator>& op) override
    {
        int value = ProcessOperator(op->GetOperand());
        Append() << UserDefinedVariableName(op->GetVariableName()) << " = " << VariableName(value)
                 << ';' << std::endl;
        Return(value);
    }